

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O0

void __thiscall
spdlog::details::circular_q<spdlog::details::async_msg>::push_back
          (circular_q<spdlog::details::async_msg> *this,async_msg *item)

{
  async_msg *in_RSI;
  ulong *in_RDI;
  async_msg *in_stack_ffffffffffffffd8;
  
  if (*in_RDI != 0) {
    std::vector<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>::operator[]
              ((vector<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_> *)
               (in_RDI + 4),in_RDI[2]);
    async_msg::operator=(in_RSI,in_stack_ffffffffffffffd8);
    in_RDI[2] = (in_RDI[2] + 1) % *in_RDI;
    if (in_RDI[2] == in_RDI[1]) {
      in_RDI[1] = (in_RDI[1] + 1) % *in_RDI;
      in_RDI[3] = in_RDI[3] + 1;
    }
  }
  return;
}

Assistant:

void push_back(T &&item) {
        if (max_items_ > 0) {
            v_[tail_] = std::move(item);
            tail_ = (tail_ + 1) % max_items_;

            if (tail_ == head_)  // overrun last item if full
            {
                head_ = (head_ + 1) % max_items_;
                ++overrun_counter_;
            }
        }
    }